

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O2

void set_socket_buffer_size(int socket_fd,Direction direction)

{
  int iVar1;
  int buffer_size;
  
  iVar1 = setsockopt(socket_fd,1,8 - (uint)(direction == SEND),&buffer_size,4);
  if (iVar1 != -1) {
    return;
  }
  throw("Error setting socket buffer size");
}

Assistant:

void set_socket_buffer_size(int socket_fd, Direction direction) {
	int buffer_size = BUFFER_SIZE;

	// set/getsockopt is the one-stop-shop for all socket options.
	// With it, you can get/set a variety of options for a given socket.
	// Arguments:
	// 1. The socket file-fd.
	// 2. The level of the socket, should be SOL_SOCKET.
	// 3. The option you want to get/set.
	// 4. The address of a value you want to get/set into.
	// 5. The memory-size of said value.
	// clang-format off

	// Set the sockets send-buffer-size (SNDBUF)
	int return_code = setsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDBUF : SO_RCVBUF,
		&buffer_size,
		sizeof buffer_size
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error setting socket buffer size");
	}
}